

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O3

_Bool fs_stdio_remove_filename(char *path)

{
  _Bool _Var1;
  ALLEGRO_FS_ENTRY *fp;
  
  fp = fs_stdio_create_entry(path);
  if (fp == (ALLEGRO_FS_ENTRY *)0x0) {
    _Var1 = _al_trace_prefix("fshook",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                             ,0x2ce,"fs_stdio_remove_filename");
    if (_Var1) {
      _al_trace_suffix("Cannot remove %s.",path);
    }
    _Var1 = false;
  }
  else {
    _Var1 = fs_stdio_remove_entry(fp);
    fs_stdio_destroy_entry(fp);
  }
  return _Var1;
}

Assistant:

static bool fs_stdio_remove_filename(const char *path)
{
   ALLEGRO_FS_ENTRY *fp;
   bool rc;

   fp = fs_stdio_create_entry(path);
   if (!fp) {
      ALLEGRO_WARN("Cannot remove %s.", path);
      return false;
   }

   rc = fs_stdio_remove_entry(fp);
   fs_stdio_destroy_entry(fp);
   return rc;
}